

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::date_t,duckdb::date_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool>
               (string_t *ldata,date_t *rdata,date_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  bool bVar1;
  date_t dVar2;
  ulong uVar3;
  ulong uVar4;
  ValidityMask *pVVar5;
  idx_t i_1;
  idx_t row_idx;
  idx_t row_idx_00;
  idx_t i;
  ulong uVar6;
  idx_t row_idx_01;
  string_t specifier;
  string_t specifier_00;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
      uVar3 = uVar6;
      if (lsel->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)lsel->sel_vector[uVar6];
      }
      uVar4 = uVar6;
      if (rsel->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)rsel->sel_vector[uVar6];
      }
      specifier.value._8_4_ = rdata[uVar4].days;
      specifier.value._0_8_ = ldata[uVar3].value.pointer.ptr;
      specifier.value._12_4_ = 0;
      dVar2 = DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t>
                        (*(DateTruncBinaryOperator **)&ldata[uVar3].value,specifier,(int32_t)uVar4);
      result_data[uVar6].days = dVar2.days;
    }
  }
  else {
    pVVar5 = lvalidity;
    for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
      row_idx_00 = row_idx;
      if (lsel->sel_vector != (sel_t *)0x0) {
        row_idx_00 = (idx_t)lsel->sel_vector[row_idx];
      }
      row_idx_01 = row_idx;
      if (rsel->sel_vector != (sel_t *)0x0) {
        row_idx_01 = (idx_t)rsel->sel_vector[row_idx];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&lvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&rvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
        if (!bVar1) goto LAB_00c64cb1;
        specifier_00.value._8_4_ = rdata[row_idx_01].days;
        specifier_00.value._0_8_ = ldata[row_idx_00].value.pointer.ptr;
        specifier_00.value._12_4_ = 0;
        dVar2 = DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t>
                          (*(DateTruncBinaryOperator **)&ldata[row_idx_00].value,specifier_00,
                           (int32_t)pVVar5);
        result_data[row_idx].days = dVar2.days;
        pVVar5 = (ValidityMask *)result_data;
      }
      else {
LAB_00c64cb1:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,row_idx);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}